

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256-ni.c
# Opt level: O0

sha256_ni * sha256_ni_alloc(void)

{
  void *pvVar1;
  sha256_ni *psVar2;
  sha256_ni *s;
  uintptr_t aligned_address;
  uintptr_t alloc_address;
  void *allocation;
  
  pvVar1 = safemalloc(0xaf,1,0);
  psVar2 = (sha256_ni *)((long)pvVar1 + 0xfU & 0xfffffffffffffff0);
  psVar2->pointer_to_free = pvVar1;
  return psVar2;
}

Assistant:

static sha256_ni *sha256_ni_alloc(void)
{
    /*
     * The __m128i variables in the context structure need to be
     * 16-byte aligned, but not all malloc implementations that this
     * code has to work with will guarantee to return a 16-byte
     * aligned pointer. So we over-allocate, manually realign the
     * pointer ourselves, and store the original one inside the
     * context so we know how to free it later.
     */
    void *allocation = smalloc(sizeof(sha256_ni) + 15);
    uintptr_t alloc_address = (uintptr_t)allocation;
    uintptr_t aligned_address = (alloc_address + 15) & ~15;
    sha256_ni *s = (sha256_ni *)aligned_address;
    s->pointer_to_free = allocation;
    return s;
}